

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFun.cpp
# Opt level: O1

void testf(float f,bool changeExpected)

{
  undefined7 in_register_00000039;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_4_2_947300af u_3;
  anon_union_4_2_947300af u;
  anon_union_4_2_947300af u_1;
  anon_union_4_2_947300af u_2;
  
  putchar(10);
  fVar1 = (float)Imath_3_2::succf(f);
  fVar2 = (float)Imath_3_2::predf(f);
  fVar3 = (float)Imath_3_2::predf(f);
  fVar3 = (float)Imath_3_2::succf(fVar3);
  fVar4 = (float)Imath_3_2::succf(f);
  fVar4 = (float)Imath_3_2::predf(fVar4);
  printf("f %.9g %x\n",(double)f,(ulong)(uint)f);
  printf("sf %.9g %x\n",(double)fVar1,(ulong)(uint)fVar1);
  printf("pf %.9g %x\n",(double)fVar2,(ulong)(uint)fVar2);
  printf("spf %.9g %x\n",(double)fVar3,(ulong)(uint)fVar3);
  printf("psf %.9g %x\n",(double)fVar4,(ulong)(uint)fVar4);
  fflush(_stdout);
  if ((int)CONCAT71(in_register_00000039,changeExpected) == 0) {
    if (NAN(f)) {
      if (!NAN(fVar2)) {
        __assert_fail("isnan (pf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x46,"void testf(float, bool)");
      }
      if (!NAN(fVar1)) {
        __assert_fail("isnan (sf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x47,"void testf(float, bool)");
      }
    }
    else {
      if (fVar2 != f) {
        __assert_fail("bit_cast<uint32_t> (pf) == bit_cast<uint32_t> (f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x4c,"void testf(float, bool)");
      }
      if (fVar1 != f) {
        __assert_fail("bit_cast<uint32_t> (sf) == bit_cast<uint32_t> (f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x4d,"void testf(float, bool)");
      }
    }
  }
  else {
    if (f <= fVar2) {
      __assert_fail("pf < f",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x3d,"void testf(float, bool)");
    }
    if (fVar1 <= f) {
      __assert_fail("f < sf",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x3e,"void testf(float, bool)");
    }
  }
  return;
}

Assistant:

void
testf (float f, bool changeExpected = true)
{
    printf ("\n");

    float sf = IMATH_INTERNAL_NAMESPACE::succf (f);
    float pf = IMATH_INTERNAL_NAMESPACE::predf (f);
    float spf =
        IMATH_INTERNAL_NAMESPACE::succf (IMATH_INTERNAL_NAMESPACE::predf (f));
    float psf =
        IMATH_INTERNAL_NAMESPACE::predf (IMATH_INTERNAL_NAMESPACE::succf (f));

    printf ("f %.9g %" PRIx32 "\n", f, bit_cast<uint32_t> (f));
    printf ("sf %.9g %" PRIx32 "\n", sf, bit_cast<uint32_t> (sf));
    printf ("pf %.9g %" PRIx32 "\n", pf, bit_cast<uint32_t> (pf));
    printf ("spf %.9g %" PRIx32 "\n", spf, bit_cast<uint32_t> (spf));
    printf ("psf %.9g %" PRIx32 "\n", psf, bit_cast<uint32_t> (psf));

    fflush (stdout);

    if (changeExpected)
    {
        assert (pf < f);
        assert (f < sf);
    }
    else
    {
        if (isnan (f))
        {
            // If f is nan, pf and sf may be converted from signaling
            // to quiet nan, but they'll still be nan's.
            assert (isnan (pf));
            assert (isnan (sf));
        }
        else
        {
            // No bit change expected if input was inf.
            assert (bit_cast<uint32_t> (pf) == bit_cast<uint32_t> (f));
            assert (bit_cast<uint32_t> (sf) == bit_cast<uint32_t> (f));
        }
    }
}